

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

void multi_thread_server(int port,string *ip,string *log_file)

{
  pointer pcVar1;
  int sockfd;
  Pass2thread *this;
  int _idx;
  pthread_t tid;
  pthread_t local_88;
  string local_80;
  client_socket local_60;
  
  sockfd = C_std::Network::Socket(2,1,0);
  pcVar1 = (ip->_M_dataplus)._M_p;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar1,pcVar1 + ip->_M_string_length);
  C_std::Network::easy_bind(sockfd,port,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  C_std::Network::Listen(sockfd,0x80);
  _idx = 1;
  do {
    this = (Pass2thread *)operator_new(0x68);
    C_std::Network::easy_accept(&local_60,sockfd);
    Pass2thread::Pass2thread(this,&local_60,log_file,_idx);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.ip._M_dataplus._M_p != &local_60.ip.field_2) {
      operator_delete(local_60.ip._M_dataplus._M_p,local_60.ip.field_2._M_allocated_capacity + 1);
    }
    POSIX::multithreading::Pthread_create(&local_88,(pthread_attr_t *)0x0,start_routine,this);
    POSIX::multithreading::Pthread_detach(local_88);
    _idx = _idx + 1;
  } while( true );
}

Assistant:

void multi_thread_server(int port, const std::string &ip, const std::string &log_file) {
    using namespace POSIX::multithreading;
    int client_num = 0;

    int listened_sockfd = Socket(AF_INET, SOCK_STREAM, 0);
    easy_bind(listened_sockfd, port, ip);
    Listen(listened_sockfd, 128);
    while (1) {
        ++client_num;
        Pass2thread *arg = new Pass2thread(easy_accept(listened_sockfd), log_file, client_num);
        pthread_t tid;
        Pthread_create(&tid, 0, start_routine, arg);
        Pthread_detach(tid);
    }
}